

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O0

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::
optimizeStep(HungarianBranching<lineage::heuristics::PartitionGraph> *this,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *first,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *second,bool mark_solution)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_t sVar4;
  runtime_error *prVar5;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *pMVar6;
  reference pvVar7;
  const_reference pvVar8;
  reference pIVar9;
  reference pvVar10;
  byte in_CL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  pair<bool,_unsigned_long> pVar11;
  pair<bool,_unsigned_long> p_1;
  size_t partitionIdB_2;
  size_t partitionIdA_1;
  IndexPair *match;
  const_iterator __end4;
  const_iterator __begin4;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  *__range4;
  size_t idx;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  matches;
  double objective;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  matcher;
  cost_t original_costs;
  value_type *partitionIdB_1;
  size_t col_1;
  double *coeff;
  pair<bool,_unsigned_long> p;
  difference_type col;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  pos;
  size_t *partitionIdB;
  VertexIterator it;
  value_type *partitionIdA;
  size_t row;
  anon_class_24_3_d1c0cc24 setCost;
  mask_t mask;
  cost_t costs;
  bipartite_graph_t bigraph;
  anon_class_16_2_7c59e3ed idxOfTerminationCol;
  anon_class_8_1_62494048 idxOfCol;
  anon_class_8_1_93e23dee idxOfBirthRow;
  anon_class_8_1_93e23dee idxOfDuplicateRow;
  anon_class_1_0_00000001 idxOfRow;
  size_t second_size;
  size_t first_size;
  size_t n_cols;
  size_t n_rows;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  *in_stack_fffffffffffffbd8;
  __normal_iterator<const_markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair_*,_std::vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>_>
  *in_stack_fffffffffffffbe0;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *pMVar12;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbe8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  PartitionGraph *in_stack_fffffffffffffc00;
  Index IVar13;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffc20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc28;
  ulong uVar14;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_stack_fffffffffffffc50;
  __normal_iterator<const_markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair_*,_std::vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>_>
  local_2b0;
  undefined1 *local_2a8;
  ulong local_2a0;
  undefined1 local_298 [24];
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *local_280;
  vector<double,_std::allocator<double>_> local_1b8;
  const_reference local_1a0;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  *local_198;
  double local_190;
  double *local_188;
  undefined1 local_180;
  unsigned_long local_178;
  unsigned_long *local_170;
  unsigned_long *local_168;
  size_t local_160;
  unsigned_long *local_158;
  unsigned_long *local_150;
  unsigned_long *local_148;
  unsigned_long *local_140;
  value_type local_138;
  value_type *local_130;
  const_reference local_108;
  ulong local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  undefined1 local_c8 [31];
  IdleGraphVisitor<unsigned_long> local_a9;
  undefined1 local_a8 [56];
  anon_class_16_2_7c59e3ed local_70;
  anon_class_8_1_62494048 local_60;
  anon_class_8_1_93e23dee local_58;
  anon_class_8_1_93e23dee local_50;
  anon_class_1_0_00000001 local_41;
  size_type local_40;
  size_type local_38;
  size_t local_30;
  size_t local_28;
  byte local_19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  local_30 = sVar2 * 2 + sVar3;
  local_28 = local_30;
  local_38 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  local_70.second_size = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
  local_50.first_size = local_38;
  local_58.first_size = local_38;
  local_60.n_rows = local_28;
  local_70.n_rows = local_28;
  local_40 = local_70.second_size;
  andres::graph::IdleGraphVisitor<unsigned_long>::IdleGraphVisitor(&local_a9);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Digraph
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (Visitor *)in_stack_fffffffffffffc10);
  memset(local_c8,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5ed2);
  memset(&local_e0,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c5ef3);
  local_f8 = local_a8;
  local_f0 = local_c8;
  local_e8 = &local_e0;
  for (local_100 = 0; uVar14 = local_100,
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
      uVar14 < sVar2; local_100 = local_100 + 1) {
    local_108 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_10,local_100);
    optimizeStep::anon_class_1_0_00000001::operator()(&local_41,local_100);
    optimizeStep::anon_class_16_2_7c59e3ed::operator()(&local_70,local_100);
    PartitionGraph::terminationCosts
              ((PartitionGraph *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (size_t)in_stack_fffffffffffffbf0._M_current);
    optimizeStep::anon_class_24_3_d1c0cc24::operator()
              ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (size_t)in_stack_fffffffffffffbf0._M_current,
               (double)in_stack_fffffffffffffbe8._M_current);
    optimizeStep::anon_class_8_1_93e23dee::operator()(&local_50,local_100);
    sVar4 = optimizeStep::anon_class_8_1_93e23dee::operator()(&local_50,local_100);
    optimizeStep::anon_class_16_2_7c59e3ed::operator()(&local_70,sVar4);
    optimizeStep::anon_class_24_3_d1c0cc24::operator()
              ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (size_t)in_stack_fffffffffffffbf0._M_current,
               (double)in_stack_fffffffffffffbe8._M_current);
    andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::verticesFromVertexBegin
              ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (size_t)in_stack_fffffffffffffbf0._M_current);
    while( true ) {
      andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::verticesFromVertexEnd
                ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                 (size_t)in_stack_fffffffffffffbf0._M_current);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar1) break;
      local_138 = andres::graph::detail::IteratorHelper<true>::operator*
                            ((IteratorHelper<true> *)0x1c6102);
      local_130 = &local_138;
      local_148 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffbd8);
      local_150 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffbd8);
      __first._M_current._7_1_ = in_stack_fffffffffffffbff;
      __first._M_current._0_7_ = in_stack_fffffffffffffbf8;
      local_140 = (unsigned_long *)
                  std::
                  find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                            (__first,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8._M_current)
      ;
      local_158 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cend
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffbd8);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar1) {
        local_168 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::cbegin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffbd8);
        local_170 = local_140;
        local_160 = std::
                    distance<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        pVar11 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                           ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                            (size_t)in_stack_fffffffffffffc40);
        local_178 = pVar11.second;
        local_180 = pVar11.first;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Could not find edge (A, B)!");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_190 = PartitionGraph::costOfEdge
                              (in_stack_fffffffffffffc00,
                               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
        local_188 = &local_190;
        optimizeStep::anon_class_1_0_00000001::operator()(&local_41,local_100);
        optimizeStep::anon_class_8_1_62494048::operator()(&local_60,local_160);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()
                  ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (size_t)in_stack_fffffffffffffbf0._M_current,
                   (double)in_stack_fffffffffffffbe8._M_current);
        optimizeStep::anon_class_8_1_93e23dee::operator()(&local_50,local_100);
        optimizeStep::anon_class_8_1_62494048::operator()(&local_60,local_160);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()
                  ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (size_t)in_stack_fffffffffffffbf0._M_current,
                   (double)in_stack_fffffffffffffbe8._M_current);
        optimizeStep::anon_class_8_1_93e23dee::operator()(&local_58,local_160);
        optimizeStep::anon_class_16_2_7c59e3ed::operator()(&local_70,local_100);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()
                  ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (size_t)in_stack_fffffffffffffbf0._M_current,
                   (double)in_stack_fffffffffffffbe8._M_current);
        optimizeStep::anon_class_8_1_93e23dee::operator()(&local_58,local_160);
        sVar4 = optimizeStep::anon_class_8_1_93e23dee::operator()(&local_50,local_100);
        in_stack_fffffffffffffc50 =
             (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
              *)optimizeStep::anon_class_16_2_7c59e3ed::operator()(&local_70,sVar4);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()
                  ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
                   CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                   (size_t)in_stack_fffffffffffffbf0._M_current,
                   (double)in_stack_fffffffffffffbe8._M_current);
      }
      andres::graph::detail::IteratorHelper<true>::operator++
                ((IteratorHelper<true> *)in_stack_fffffffffffffbe0);
    }
  }
  local_198 = (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
               *)0x0;
  while (pMVar12 = local_198,
        pMVar6 = (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                  *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18),
        pMVar12 < pMVar6) {
    local_1a0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_18,(size_type)local_198);
    in_stack_fffffffffffffc40 =
         (vector<double,_std::allocator<double>_> *)
         optimizeStep::anon_class_8_1_93e23dee::operator()(&local_58,(size_t)local_198);
    in_stack_fffffffffffffc38 =
         (vector<int,_std::allocator<int>_> *)
         optimizeStep::anon_class_8_1_62494048::operator()(&local_60,(size_t)local_198);
    in_stack_fffffffffffffc30 =
         (vector<double,_std::allocator<double>_> *)
         PartitionGraph::birthCosts
                   ((PartitionGraph *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                    (size_t)in_stack_fffffffffffffbf0._M_current);
    optimizeStep::anon_class_24_3_d1c0cc24::operator()
              ((anon_class_24_3_d1c0cc24 *)in_stack_fffffffffffffc00,
               CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
               (size_t)in_stack_fffffffffffffbf0._M_current,
               (double)in_stack_fffffffffffffbe8._M_current);
    local_198 = (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                 *)((long)&(((vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                              *)&local_198->graph_)->
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::Matching(in_stack_fffffffffffffc50,
             (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)pMVar12,
             in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::run(in_stack_fffffffffffffc10);
  local_280 = (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
               *)0x0;
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::matches(pMVar12);
  local_2a0 = 0;
  while (uVar14 = local_2a0, sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_e0),
        uVar14 < sVar2) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,local_2a0);
    if (*pvVar7 == 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b8,local_2a0);
      local_280 = (Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                   *)(*pvVar8 + (double)local_280);
    }
    local_2a0 = local_2a0 + 1;
  }
  if ((local_19 & 1) != 0) {
    local_2a8 = local_298;
    local_2b0._M_current =
         (IndexPair *)
         std::
         vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
         ::begin(in_stack_fffffffffffffbd8);
    std::
    vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
    ::end(in_stack_fffffffffffffbd8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffbe0,
                              (__normal_iterator<const_markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair_*,_std::vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>_>
                               *)in_stack_fffffffffffffbd8), bVar1) {
      pIVar9 = __gnu_cxx::
               __normal_iterator<const_markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair_*,_std::vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>_>
               ::operator*(&local_2b0);
      IVar13 = pIVar9->col;
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
      if (IVar13 < sVar2 + local_28) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (local_18,pIVar9->col - local_28);
        IVar13 = pIVar9->row;
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
        if (IVar13 < sVar2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (local_10,pIVar9->row);
        }
        else {
          IVar13 = pIVar9->row;
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
          this_00 = local_10;
          if (sVar2 << 1 <= IVar13) goto LAB_001c69d1;
          IVar13 = pIVar9->row;
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (this_00,IVar13 - sVar2);
        }
        pVar11 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                           ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                            in_stack_fffffffffffffc50,(size_t)pMVar12,
                            (size_t)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffbf0._M_current = (unsigned_long *)pVar11.second;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"Could not find matched edge!");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x28),(size_type)in_stack_fffffffffffffbf0._M_current);
        *pvVar10 = '\x01';
      }
LAB_001c69d1:
      __gnu_cxx::
      __normal_iterator<const_markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair_*,_std::vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>_>
      ::operator++(&local_2b0);
    }
  }
  pMVar12 = local_280;
  std::
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ::~vector((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
             *)in_stack_fffffffffffffbf0._M_current);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~Matching(pMVar12);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0._M_current);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::~Digraph
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)pMVar12);
  return (double)pMVar12;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimizeStep(std::vector<size_t> const& first,
                                        std::vector<size_t> const& second,
                                        bool mark_solution)
{
    // setup cost for matching.
    const size_t n_rows = 2 * first.size() + second.size();
    const size_t n_cols = n_rows;

    // lookup for auxiliary nodes.
    const size_t first_size = first.size();
    const size_t second_size = second.size();
    auto idxOfRow = [=](size_t row) { return row; };
    auto idxOfDuplicateRow = [=](size_t row) { return first_size + row; };
    auto idxOfBirthRow = [=](size_t col) { return 2 * first_size + col; };
    auto idxOfCol = [=](size_t col) { return n_rows + col; };
    auto idxOfTerminationCol = [=](size_t row) {
        return n_rows + second_size + row;
    };

    // construct auxiliary graph for matching.
    auto bigraph = bipartite_graph_t(n_rows + n_cols);
    auto costs = cost_t();
    auto mask = mask_t();

    auto setCost = [&](size_t row, size_t col, double val) {
        bigraph.insertEdge(row, col);
        costs.emplace_back(val);
        mask.emplace_back(0);
    };

    for (size_t row = 0; row < first.size(); ++row) {

        auto const& partitionIdA = first[row];

        // termination costs.

        setCost(idxOfRow(row), idxOfTerminationCol(row),
                this->graph_.terminationCosts(partitionIdA));
        setCost(idxOfDuplicateRow(row),
                idxOfTerminationCol(idxOfDuplicateRow(row)), .0);

        for (auto it = this->graph_.verticesFromVertexBegin(partitionIdA);
             it != this->graph_.verticesFromVertexEnd(partitionIdA); ++it) {
            auto const& partitionIdB = *it;

            const auto pos =
                std::find(second.cbegin(), second.cend(), partitionIdB);
            if (pos == second.cend()) { // if maxDistance is limited, then it
                                        // might be that the edge is not found.
                continue;
                // throw std::runtime_error(
                //        "Could not find neighbouring partition in frame
                //        t+1!");
            }
            const auto col = std::distance(second.cbegin(), pos);

            const auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find edge (A, B)!");

            auto const& coeff = this->graph_.costOfEdge(p.second);

            setCost(idxOfRow(row), idxOfCol(col), coeff);
            setCost(idxOfDuplicateRow(row), idxOfCol(col), coeff);

            // auxiliary edges.
            setCost(idxOfBirthRow(col), idxOfTerminationCol(row), .0);
            setCost(idxOfBirthRow(col),
                    idxOfTerminationCol(idxOfDuplicateRow(row)), .0);
        }
    }

    // birth costs.
    for (size_t col = 0; col < second.size(); ++col) {
        auto const& partitionIdB = second[col];
        setCost(idxOfBirthRow(col), idxOfCol(col),
                this->graph_.birthCosts(partitionIdB));
    }

    // Matching modifies the costs of the given vector, so we make a copy for
    // objective calculation later on.
    auto const original_costs = costs;

    auto matcher =
        markurem::matching::Matching<bipartite_graph_t, cost_t, mask_t>(
            bigraph, costs, mask);
    matcher.run();

    // calculate objective and mark edges.
    double objective = .0;
    auto const matches = matcher.matches();

    for (size_t idx = 0; idx < mask.size(); ++idx)
        if (mask[idx] == 1)
            objective += original_costs[idx];

    if (mark_solution) {
        for (auto const& match : matches) {
            // if the match involves to original nodes, then
            // mark the edge as matched in the solution.
            size_t partitionIdA, partitionIdB;
            if (match.col >= second.size() + n_rows)
                continue;
            else
                partitionIdB = second[match.col - n_rows];

            if (match.row < first.size())
                partitionIdA = first[match.row];
            else if (match.row < 2 * first.size())
                partitionIdA = first[match.row - first.size()];
            else
                continue;

            auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find matched edge!");

            solution_[p.second] = true;
        }
    }

    return objective;
}